

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

uint Fossilize::default_get_member_uint(Value *value,char *member,uint default_value)

{
  uint uVar1;
  Number in_RAX;
  Number NVar2;
  undefined8 local_18;
  
  local_18 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe8,(Ch *)value);
  NVar2.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(value);
  uVar1 = 0;
  if ((local_18 != NVar2.i64) && (uVar1 = 0, (*(byte *)(local_18 + 0x1e) & 0x40) != 0)) {
    uVar1 = (((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(local_18 + 0x10))->data_).s.length;
  }
  return uVar1;
}

Assistant:

static unsigned default_get_member_uint(const Value &value, const char *member, unsigned default_value = 0)
{
	auto *memb = maybe_get_member(value, member);
	if (!memb)
		return default_value;
	if (!memb->IsUint())
		return default_value;
	return memb->GetUint();
}